

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_fireproof(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  int iVar3;
  undefined2 in_SI;
  undefined2 in_DI;
  OBJ_AFFECT_DATA oaf;
  OBJ_DATA *obj;
  OBJ_AFFECT_DATA *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9a;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  undefined2 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa2;
  undefined2 uVar5;
  undefined2 in_stack_ffffffffffffffa4;
  undefined2 uVar6;
  undefined2 in_stack_ffffffffffffffa6;
  
  bVar1 = is_obj_stat((OBJ_DATA *)
                      CONCAT26(in_stack_ffffffffffffff9e,
                               CONCAT24(in_stack_ffffffffffffff9c,
                                        CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98
                                                ))),in_stack_ffffffffffffff94);
  if (bVar1) {
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,
                         CONCAT24(in_stack_ffffffffffffffa4,
                                  CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0))),
        (CHAR_DATA *)
        CONCAT26(in_stack_ffffffffffffff9e,
                 CONCAT24(in_stack_ffffffffffffff9c,
                          CONCAT22(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98))),
        (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
        in_stack_ffffffffffffff88,0);
  }
  else {
    init_affect_obj((OBJ_AFFECT_DATA *)0x616057);
    uVar4 = 0;
    iVar3 = number_fuzzy(in_stack_ffffffffffffff94);
    uVar2 = (undefined2)iVar3;
    uVar5 = 0;
    uVar6 = 0;
    std::pow<int,int>(0,0x6160a5);
    affect_to_obj((OBJ_DATA *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff88);
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(uVar6,CONCAT22(uVar5,uVar2))),
        (CHAR_DATA *)CONCAT26(in_SI,CONCAT24(in_DI,CONCAT22(uVar4,in_stack_ffffffffffffff98))),
        (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
        in_stack_ffffffffffffff88,0);
    act((char *)CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(uVar6,CONCAT22(uVar5,uVar2))),
        (CHAR_DATA *)CONCAT26(in_SI,CONCAT24(in_DI,CONCAT22(uVar4,in_stack_ffffffffffffff98))),
        (void *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
        in_stack_ffffffffffffff88,0);
  }
  return;
}

Assistant:

void spell_fireproof(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	OBJ_DATA *obj = (OBJ_DATA *)vo;
	OBJ_AFFECT_DATA oaf;

	if (is_obj_stat(obj, ITEM_BURN_PROOF))
	{
		act("$p is already protected from burning.", ch, obj, nullptr, TO_CHAR);
		return;
	}

	init_affect_obj(&oaf);
	oaf.where = TO_OBJ_AFFECTS;
	oaf.type = sn;
	oaf.level = level;
	oaf.duration = number_fuzzy(level / 4);
	oaf.location = APPLY_NONE;
	oaf.modifier = 0;
	SET_BIT(oaf.bitvector, ITEM_BURN_PROOF);

	affect_to_obj(obj, &oaf);

	act("You protect $p from fire.", ch, obj, nullptr, TO_CHAR);
	act("$p is surrounded by a protective aura.", ch, obj, nullptr, TO_ROOM);
}